

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O3

QIcon * __thiscall QCache<QString,_QIcon>::relink(QCache<QString,_QIcon> *this,QString *key)

{
  Chain *pCVar1;
  Chain *pCVar2;
  Node *pNVar3;
  QIcon *pQVar4;
  
  if ((this->d).size != 0) {
    pNVar3 = QHashPrivate::Data<QCache<QString,_QIcon>::Node>::findNode<QString>(&this->d,key);
    if (pNVar3 == (Node *)0x0) {
      pQVar4 = (QIcon *)0x0;
    }
    else {
      if ((Node *)(this->chain).next != pNVar3) {
        pCVar1 = (pNVar3->super_Chain).prev;
        pCVar2 = (pNVar3->super_Chain).next;
        pCVar1->next = pCVar2;
        pCVar2->prev = pCVar1;
        pCVar1 = (this->chain).next;
        (pNVar3->super_Chain).next = pCVar1;
        pCVar1->prev = &pNVar3->super_Chain;
        (pNVar3->super_Chain).prev = &this->chain;
        (this->chain).next = &pNVar3->super_Chain;
      }
      pQVar4 = (pNVar3->value).t;
    }
    return pQVar4;
  }
  return (QIcon *)0x0;
}

Assistant:

inline bool isEmpty() const noexcept { return !d.size; }